

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

int __thiscall Polynomial::evaluate(Polynomial *this,int *pt)

{
  pointer piVar1;
  int extraout_EAX;
  int iVar2;
  undefined8 *puVar3;
  int i;
  long lVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  double in_XMM0_Qa;
  
  piVar1 = (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar4 = 0; lVar4 < this->mNumStates; lVar4 = lVar4 + 1) {
    piVar1[lVar4] = (int)lVar4;
  }
  piVar1 = (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar4 = 0; lVar4 < this->mNumVariables; lVar4 = lVar4 + 1) {
    piVar1[this->mNumStates + lVar4] = pt[lVar4];
  }
  lVar4 = (long)this->mFirstOperation;
  piVar1 = (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar5 = &(this->mOperands).
            super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4].args;
  do {
    if (this->mResultLocation < lVar4) {
      return piVar1[this->mResultLocation];
    }
    puVar3 = (undefined8 *)((long)pvVar5 + (long)this->mFirstOperation * -0x20);
    switch(*(undefined4 *)(puVar3 + -1)) {
    case 0:
      iVar2 = piVar1[((int *)*puVar3)[1]] + piVar1[*(int *)*puVar3];
      goto LAB_00106c8f;
    case 1:
      iVar2 = piVar1[((int *)*puVar3)[1]] * piVar1[*(int *)*puVar3];
LAB_00106c8f:
      iVar2 = iVar2 % this->mNumStates;
      break;
    case 2:
      in_XMM0_Qa = exp(this,in_XMM0_Qa);
      iVar2 = extraout_EAX;
      break;
    case 3:
      iVar2 = ~piVar1[*(int *)*puVar3] + this->mNumStates;
      break;
    case 4:
      iVar2 = piVar1[((int *)*puVar3)[1]];
      if (piVar1[((int *)*puVar3)[1]] < piVar1[*(int *)*puVar3]) {
        iVar2 = piVar1[*(int *)*puVar3];
      }
      break;
    case 5:
      iVar2 = piVar1[*(int *)*puVar3];
      if (piVar1[((int *)*puVar3)[1]] < piVar1[*(int *)*puVar3]) {
        iVar2 = piVar1[((int *)*puVar3)[1]];
      }
      break;
    default:
      goto switchD_00106c24_default;
    }
    piVar1[lVar4] = iVar2;
switchD_00106c24_default:
    lVar4 = lVar4 + 1;
    pvVar5 = (vector<int,_std::allocator<int>_> *)((long)(pvVar5 + 1) + 8);
  } while( true );
}

Assistant:

int Polynomial::evaluate(const int pt[]) {
  // ASSUME: pt is a pointer to an array 0..numvars-1 of values in the range 0..numConstants-1
  // evaluate at a point
  // 1. fill in the n variables values in the array 'mEvaluationValues'.
  for (int i=0; i < mNumStates; ++i)
    mEvaluationValues[i] = i;
  for (int i=0; i<mNumVariables; i++)
    mEvaluationValues[i + mNumStates] = pt[i];
  for (int i = mFirstOperation; i <= mResultLocation; i++)
    {
      operand& a = mOperands[i-mFirstOperation];
      switch (a.op) {
      case operandType::PLUS:
        mEvaluationValues[i] = (mEvaluationValues[a.args[0]]
                                + mEvaluationValues[a.args[1]]) % mNumStates;
        break;
      case operandType::TIMES:
        mEvaluationValues[i] = (mEvaluationValues[a.args[0]]
                                * mEvaluationValues[a.args[1]]) % mNumStates;
        break;
      case operandType::POWER:
        mEvaluationValues[i] = exp(mEvaluationValues[a.args[0]], a.args[1]);
        break;
      case operandType::MAX:
        mEvaluationValues[i] = std::max(mEvaluationValues[a.args[0]],
                                        mEvaluationValues[a.args[1]]);
        break;
      case operandType::MIN:
        mEvaluationValues[i] = std::min(mEvaluationValues[a.args[0]],
                                        mEvaluationValues[a.args[1]]);
        break;
      case operandType::NOT:
        mEvaluationValues[i] = mNumStates - 1 - mEvaluationValues[a.args[0]];
        break;
      }
    }
  return mEvaluationValues[mResultLocation];
}